

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.h
# Opt level: O3

result_type * __thiscall
jbcoin::
sha512Half<unsigned_short,jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>,unsigned_int>
          (result_type *__return_storage_ptr__,jbcoin *this,unsigned_short *args,
          base_uint<160UL,_jbcoin::detail::AccountIDTag> *args_1,uint *args_2)

{
  uint uVar1;
  sha512_half_hasher h;
  uint local_104;
  SHA512_CTX local_100;
  
  SHA512_Init(&local_100);
  local_104 = CONCAT22(local_104._2_2_,*(ushort *)this << 8 | *(ushort *)this >> 8);
  SHA512_Update(&local_100,&local_104,2);
  SHA512_Update(&local_100,args,0x14);
  uVar1 = args_1->pn[0];
  local_104 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  SHA512_Update(&local_100,&local_104,4);
  detail::basic_sha512_half_hasher::operator_cast_to_base_uint
            (__return_storage_ptr__,(basic_sha512_half_hasher *)&local_100);
  return __return_storage_ptr__;
}

Assistant:

sha512_half_hasher::result_type
sha512Half (Args const&... args)
{
    sha512_half_hasher h;
    using beast::hash_append;
    hash_append(h, args...);
    return static_cast<typename
        sha512_half_hasher::result_type>(h);
}